

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_pow10.cpp
# Opt level: O0

void __thiscall sc_dt::scfx_pow10::scfx_pow10(scfx_pow10 *this)

{
  double a;
  double in_RDI;
  int i;
  scfx_rep *in_stack_ffffffffffffff08;
  scfx_rep *in_stack_ffffffffffffff10;
  scfx_rep *in_stack_ffffffffffffff20;
  undefined8 local_98;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar1;
  
  a = in_RDI;
  do {
    scfx_rep::scfx_rep(in_stack_ffffffffffffff20);
    a = (double)((long)a + 0x28);
  } while (a != (double)((long)in_RDI + 0x500));
  local_98 = (long)in_RDI + 0x500;
  do {
    scfx_rep::scfx_rep(in_stack_ffffffffffffff20);
    local_98 = local_98 + 0x28;
  } while (local_98 != (long)in_RDI + 0xa00);
  scfx_rep::scfx_rep((scfx_rep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),a);
  scfx_rep::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  scfx_rep::~scfx_rep((scfx_rep *)0x25ceb7);
  scfx_rep::scfx_rep((scfx_rep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),a);
  scfx_rep::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  scfx_rep::~scfx_rep((scfx_rep *)0x25cef8);
  for (iVar1 = 1; iVar1 < 0x20; iVar1 = iVar1 + 1) {
    scfx_rep::set_nan(in_stack_ffffffffffffff10);
    scfx_rep::set_nan(in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

scfx_pow10::scfx_pow10()
{
    m_pos[0] = scfx_rep( 10.0 );
    m_neg[0] = scfx_rep( 0.1 );

    for( int i = 1; i < SCFX_POW10_TABLE_SIZE; i ++ )
    {
        m_pos[i].set_nan();
	m_neg[i].set_nan();
    }
}